

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::ConvertToSampledImagePass::GetSampledImageTypeForImage
          (ConvertToSampledImagePass *this,Instruction *image_variable)

{
  int iVar1;
  Type *pTVar2;
  undefined4 extraout_var;
  IRContext *this_00;
  TypeManager *this_01;
  undefined1 local_a8 [8];
  SampledImage sampled_image_type;
  Image image_type_for_sampled_image;
  Image *image_type;
  Type *variable_type;
  Instruction *image_variable_local;
  ConvertToSampledImagePass *this_local;
  
  pTVar2 = GetVariableType(this,image_variable);
  if (pTVar2 == (Type *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    iVar1 = (*pTVar2->_vptr_Type[0x12])();
    if ((Image *)CONCAT44(extraout_var,iVar1) == (Image *)0x0) {
      this_local._4_4_ = 0;
    }
    else {
      analysis::Image::Image
                ((Image *)&sampled_image_type.image_type_,(Image *)CONCAT44(extraout_var,iVar1));
      analysis::SampledImage::SampledImage
                ((SampledImage *)local_a8,(Type *)&sampled_image_type.image_type_);
      this_00 = Pass::context(&this->super_Pass);
      this_01 = IRContext::get_type_mgr(this_00);
      this_local._4_4_ = analysis::TypeManager::GetTypeInstruction(this_01,(Type *)local_a8);
      analysis::SampledImage::~SampledImage((SampledImage *)local_a8);
      analysis::Image::~Image((Image *)&sampled_image_type.image_type_);
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t ConvertToSampledImagePass::GetSampledImageTypeForImage(
    Instruction* image_variable) {
  const auto* variable_type = GetVariableType(*image_variable);
  if (variable_type == nullptr) return 0;
  const auto* image_type = variable_type->AsImage();
  if (image_type == nullptr) return 0;

  analysis::Image image_type_for_sampled_image(*image_type);
  analysis::SampledImage sampled_image_type(&image_type_for_sampled_image);
  return context()->get_type_mgr()->GetTypeInstruction(&sampled_image_type);
}